

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O3

StringTree * __thiscall
capnp::anon_unknown_2::Indent::delimit
          (StringTree *__return_storage_ptr__,Indent *this,Array<kj::StringTree> *items,
          PrintMode mode,PrintKind kind)

{
  uint uVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Branch *pBVar6;
  char *pcVar7;
  StringTree *extraout_RAX;
  size_t *psVar8;
  StringTree *pSVar9;
  long lVar10;
  undefined8 *puVar11;
  undefined4 in_register_00000084;
  FixedArray<char,_1UL> *params_2;
  StringTree *item;
  ulong uVar12;
  StringPtr delim;
  StringPtr delim_00;
  Array<char> delimArrayPtr_heap;
  char delimArrayPtr_stack [32];
  undefined1 local_e1 [57];
  StringTree local_a8;
  StringTree local_68;
  
  params_2 = (FixedArray<char,_1UL> *)CONCAT44(in_register_00000084,kind);
  local_e1._1_8_ = items;
  local_e1._13_4_ = mode;
  local_e1._17_8_ = __return_storage_ptr__;
  local_e1._49_8_ = this;
  if ((this->amount != 0) && (items->size_ != 0)) {
    pSVar9 = items->ptr;
    lVar10 = items->size_ * 0x38;
    uVar12 = 0;
    do {
      if (0x18 < pSVar9->size_) {
LAB_0015de95:
        uVar3 = local_e1._49_8_;
        uVar1 = *(uint *)local_e1._49_8_ * 2 + 3;
        if (uVar1 < 0x21) {
          local_e1._25_8_ = (size_t *)0x0;
          local_e1._33_8_ = 0;
          local_e1._41_8_ = (undefined8 *)0x0;
          psVar8 = &local_68.text.content.size_;
          puVar11 = (undefined8 *)0x0;
        }
        else {
          uVar12 = (ulong)uVar1;
          params_2 = (FixedArray<char,_1UL> *)0x0;
          psVar8 = (size_t *)
                   kj::_::HeapArrayDisposer::allocateImpl
                             (1,uVar12,uVar12,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
          ;
          puVar11 = &kj::_::HeapArrayDisposer::instance;
          local_e1._41_8_ = &kj::_::HeapArrayDisposer::instance;
          local_e1._25_8_ = psVar8;
          local_e1._33_8_ = uVar12;
        }
        uVar5 = local_e1._33_8_;
        uVar4 = local_e1._25_8_;
        *(undefined2 *)psVar8 = 0xa2c;
        memset((undefined2 *)((long)psVar8 + 2),0x20,(ulong)(*(uint *)uVar3 * 2));
        *(undefined1 *)((long)psVar8 + (ulong)(*(uint *)uVar3 * 2 + 2)) = 0;
        delim_00.content.size_._0_4_ = *(uint *)uVar3 * 2 + 3;
        delim_00.content.ptr = (char *)psVar8;
        delim_00.content.size_._4_4_ = 0;
        kj::StringTree::StringTree(&local_a8,(Array<kj::StringTree> *)local_e1._1_8_,delim_00);
        local_68.size_ = (size_t)" ";
        if (local_e1._13_4_ != BARE) {
          local_68.size_ = (size_t)((long)psVar8 + 1);
        }
        local_68.text.content.ptr = (char *)strlen((char *)local_68.size_);
        local_e1[0] = 0x20;
        pSVar9 = kj::StringTree::
                 concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::FixedArray<char,1ul>>
                           ((StringTree *)local_e1._17_8_,&local_68,
                            (ArrayPtr<const_char> *)&local_a8,(StringTree *)local_e1,params_2);
        sVar2 = local_a8.branches.size_;
        pBVar6 = local_a8.branches.ptr;
        if (local_a8.branches.ptr != (Branch *)0x0) {
          local_a8.branches.ptr = (Branch *)0x0;
          local_a8.branches.size_ = 0;
          pSVar9 = (StringTree *)
                   (*(code *)**(undefined8 **)local_a8.branches.disposer)
                             (local_a8.branches.disposer,pBVar6,0x40,sVar2,sVar2,
                              kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
        }
        lVar10 = CONCAT71(local_a8.text.content.ptr._1_7_,local_a8.text.content.ptr._0_1_);
        if (lVar10 != 0) {
          uVar3 = CONCAT71(local_a8.text.content.size_._1_7_,(undefined1)local_a8.text.content.size_
                          );
          local_a8.text.content.ptr._0_1_ = 0;
          local_a8.text.content.ptr._1_7_ = 0;
          local_a8.text.content.size_._0_1_ = 0;
          local_a8.text.content.size_._1_7_ = 0;
          pSVar9 = (StringTree *)
                   (*(code *)**(undefined8 **)
                               CONCAT71(local_a8.text.content.disposer._1_7_,
                                        local_a8.text.content.disposer._0_1_))
                             ((undefined8 *)
                              CONCAT71(local_a8.text.content.disposer._1_7_,
                                       local_a8.text.content.disposer._0_1_),lVar10,1,uVar3,uVar3,0)
          ;
        }
        if ((size_t *)uVar4 == (size_t *)0x0) {
          return pSVar9;
        }
        local_e1._25_8_ = 0;
        local_e1._33_8_ = 0;
        pSVar9 = (StringTree *)(**(code **)*puVar11)(puVar11,uVar4,1,uVar5,uVar5,0);
        return pSVar9;
      }
      local_a8.text.content.size_._0_1_ = 0;
      local_a8.text.content.size_._1_7_ = 0;
      local_a8.text.content.disposer._0_1_ = 0;
      local_a8.size_ = 0;
      local_a8.text.content.ptr._0_1_ = 0;
      local_a8.text.content.ptr._1_7_ = 0;
      kj::StringTree::flattenTo(pSVar9,(char *)&local_a8);
      sVar2 = pSVar9->size_;
      *(undefined1 *)((long)&local_a8.size_ + sVar2) = 0;
      pcVar7 = strchr((char *)&local_a8,10);
      if ((pcVar7 != (char *)0x0) || ((kind == RECORD && (uVar12 = uVar12 + sVar2, 0x40 < uVar12))))
      goto LAB_0015de95;
      pSVar9 = pSVar9 + 1;
      lVar10 = lVar10 + -0x38;
    } while (lVar10 != 0);
  }
  delim.content.size_ = 3;
  delim.content.ptr = ", ";
  kj::StringTree::StringTree
            ((StringTree *)local_e1._17_8_,(Array<kj::StringTree> *)local_e1._1_8_,delim);
  return extraout_RAX;
}

Assistant:

kj::StringTree delimit(kj::Array<kj::StringTree> items, PrintMode mode, PrintKind kind) {
    if (amount == 0 || canPrintAllInline(items, kind)) {
      return kj::StringTree(kj::mv(items), ", ");
    } else {
      KJ_STACK_ARRAY(char, delimArrayPtr, amount * 2 + 3, 32, 256);
      auto delim = delimArrayPtr.begin();
      delim[0] = ',';
      delim[1] = '\n';
      memset(delim + 2, ' ', amount * 2);
      delim[amount * 2 + 2] = '\0';

      // If the outer value isn't being printed on its own line, we need to add a newline/indent
      // before the first item, otherwise we only add a space on the assumption that it is preceded
      // by an open bracket or parenthesis.
      return kj::strTree(mode == BARE ? " " : delim + 1,
          kj::StringTree(kj::mv(items), kj::StringPtr(delim, amount * 2 + 2)), ' ');
    }
  }